

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

bool google::protobuf::safe_strtof(char *str,float *value)

{
  char *in_RAX;
  int *piVar1;
  bool bVar2;
  float fVar3;
  char *local_28;
  char *endptr;
  
  local_28 = in_RAX;
  piVar1 = __errno_location();
  *piVar1 = 0;
  fVar3 = strtof(str,&local_28);
  *value = fVar3;
  if ((*str == '\0') || (*local_28 != '\0')) {
    bVar2 = false;
  }
  else {
    bVar2 = *piVar1 == 0;
  }
  return bVar2;
}

Assistant:

bool safe_strtof(const char* str, float* value) {
  char* endptr;
  errno = 0;  // errno only gets set on errors
#if defined(_WIN32) || defined (__hpux)  // has no strtof()
  *value = internal::NoLocaleStrtod(str, &endptr);
#else
  *value = strtof(str, &endptr);
#endif
  return *str != 0 && *endptr == 0 && errno == 0;
}